

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QAsn1Element>::emplace<QAsn1Element_const&>
          (QMovableArrayOps<QAsn1Element> *this,qsizetype i,QAsn1Element *args)

{
  QAsn1Element **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  QAsn1Element local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size == i
       ) {
      qVar4 = QArrayDataPointer<QAsn1Element>::freeSpaceAtEnd
                        ((QArrayDataPointer<QAsn1Element> *)this);
      if (qVar4 == 0) goto LAB_0011442e;
      QAsn1Element::QAsn1Element
                ((this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
                 ptr + (this->super_QGenericArrayOps<QAsn1Element>).
                       super_QArrayDataPointer<QAsn1Element>.size,args);
LAB_00114525:
      pqVar2 = &(this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001144e2;
    }
LAB_0011442e:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QAsn1Element>::freeSpaceAtBegin
                        ((QArrayDataPointer<QAsn1Element> *)this);
      if (qVar4 != 0) {
        QAsn1Element::QAsn1Element
                  ((this->super_QGenericArrayOps<QAsn1Element>).
                   super_QArrayDataPointer<QAsn1Element>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QAsn1Element>).
                   super_QArrayDataPointer<QAsn1Element>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00114525;
      }
    }
  }
  local_58.mValue.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_58.mValue.d.size = -0x5555555555555556;
  local_58.mType = 0xaa;
  local_58._1_7_ = 0xaaaaaaaaaaaaaa;
  local_58.mValue.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QAsn1Element::QAsn1Element(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size !=
          0;
  QArrayDataPointer<QAsn1Element>::detachAndGrow
            ((QArrayDataPointer<QAsn1Element> *)this,(uint)(i == 0 && bVar5),1,(QAsn1Element **)0x0,
             (QArrayDataPointer<QAsn1Element> *)0x0);
  if (i == 0 && bVar5) {
    QAsn1Element::QAsn1Element
              ((this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
               ptr + -1,&local_58);
    ppQVar1 = &(this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QAsn1Element> *)this,i,1);
    QAsn1Element::QAsn1Element(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58.mValue.d);
LAB_001144e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }